

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt__csctx_rmove_to(stbtt__csctx *ctx,float dx,float dy)

{
  float fVar1;
  float fVar2;
  
  stbtt__csctx_close_shape(ctx);
  fVar1 = dx + ctx->x;
  ctx->x = fVar1;
  ctx->first_x = fVar1;
  fVar2 = dy + ctx->y;
  ctx->y = fVar2;
  ctx->first_y = fVar2;
  stbtt__csctx_v(ctx,'\x01',(int)fVar1,(int)fVar2,0,0,0,0);
  return;
}

Assistant:

static void stbtt__csctx_rmove_to(stbtt__csctx *ctx, float dx, float dy)
{
   stbtt__csctx_close_shape(ctx);
   ctx->first_x = ctx->x = ctx->x + dx;
   ctx->first_y = ctx->y = ctx->y + dy;
   stbtt__csctx_v(ctx, STBTT_vmove, (int)ctx->x, (int)ctx->y, 0, 0, 0, 0);
}